

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::encode_run_interruption_error
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
           *this,context_run_mode *context,int32_t error_value)

{
  int iVar1;
  bool bVar2;
  int32_t k;
  int32_t iVar3;
  int iVar4;
  
  k = context_run_mode::get_golomb_code(context);
  bVar2 = context_run_mode::compute_map(context,error_value,k);
  iVar4 = -error_value;
  if (0 < error_value) {
    iVar4 = error_value;
  }
  iVar1 = context->run_interruption_type_;
  iVar3 = context_run_mode::compute_error_value(context,iVar4 * 2 - (uint)bVar2,k);
  if (iVar3 == error_value) {
    iVar4 = (iVar4 * 2 - iVar1) - (uint)bVar2;
    encode_mapped_value(this,k,iVar4,
                        ~*(uint *)(J + (long)this->run_index_ * 4) + (this->traits_).limit);
    context_run_mode::update_variables(context,error_value,iVar4,this->reset_threshold_);
    return;
  }
  __assert_fail("error_value == context.compute_error_value(e_mapped_error_value + context.run_interruption_type(), k)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,0x306,
                "void charls::jls_codec<charls::default_traits<unsigned char, charls::triplet<unsigned char>>, charls::encoder_strategy>::encode_run_interruption_error(context_run_mode &, const int32_t) [Traits = charls::default_traits<unsigned char, charls::triplet<unsigned char>>, Strategy = charls::encoder_strategy]"
               );
}

Assistant:

void encode_run_interruption_error(context_run_mode& context, const int32_t error_value)
    {
        const int32_t k{context.get_golomb_code()};
        const bool map{context.compute_map(error_value, k)};
        const int32_t e_mapped_error_value{2 * std::abs(error_value) - context.run_interruption_type() -
                                           static_cast<int32_t>(map)};

        ASSERT(error_value == context.compute_error_value(e_mapped_error_value + context.run_interruption_type(), k));
        encode_mapped_value(k, e_mapped_error_value, traits_.limit - J[run_index_] - 1);
        context.update_variables(error_value, e_mapped_error_value, reset_threshold_);
    }